

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kepler.c
# Opt level: O3

int SolveProblem(ProgramArgs *args,ProblemResult *result,SUNContext sunctx)

{
  int iVar1;
  ProblemResult *pPVar2;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  int iVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  FILE *__stream;
  FILE *pFVar9;
  double *pdVar10;
  char *pcVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble lVar12;
  longdouble lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int rootsfound;
  void *arkode_mem;
  sunrealtype tret;
  double local_220;
  uint local_214;
  double local_210;
  undefined8 local_208;
  int local_200;
  longdouble local_1fc;
  sunrealtype local_1f0;
  FILE *local_1e8;
  undefined8 *local_1e0;
  double local_1d8;
  FILE *local_1d0;
  undefined8 local_1c8;
  ProblemResult *local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138 [33];
  
  local_208 = 0;
  local_214 = 0;
  iVar5 = args->count_orbits;
  local_210 = (double)CONCAT44(local_210._4_4_,args->step_mode);
  iVar4 = args->stepper;
  iVar1 = args->use_compsums;
  local_200 = args->num_output_times;
  pcVar11 = args->method_name;
  dVar16 = args->dt;
  local_1f0 = args->tf;
  local_1c0 = result;
  puts("\n   Begin Kepler Problem\n");
  fwrite("Problem Arguments:\n",0x13,1,_stdout);
  fprintf(_stdout,"  stepper:              %d\n",(ulong)(uint)args->stepper);
  fprintf(_stdout,"  step mode:            %d\n",(ulong)(uint)args->step_mode);
  fprintf(_stdout,"  use tstop:            %d\n",(ulong)(uint)args->use_tstop);
  fprintf(_stdout,"  use compensated sums: %d\n",(ulong)(uint)args->use_compsums);
  fprintf(_stdout,"  dt:                   %Lg\n");
  fprintf(_stdout,"  Tf:                   %Lg\n");
  fprintf(_stdout,"  nout:                 %d\n\n",(ulong)(uint)args->num_output_times);
  local_1e0 = (undefined8 *)malloc(8);
  *local_1e0 = 0x3fe3333333333333;
  uVar6 = N_VNew_Serial(4,sunctx);
  local_1c8 = N_VGetArrayPointer(uVar6);
  puVar7 = (undefined8 *)N_VGetArrayPointer(uVar6);
  *puVar7 = 0x3fd999999999999a;
  puVar7[1] = 0;
  puVar7[2] = 0;
  puVar7[3] = 0x4000000000000000;
  if (iVar4 == 0) {
    uVar8 = SPRKStepCreate(0,force,velocity,uVar6,sunctx);
    local_208 = uVar8;
    if (iVar5 != 0) {
      ARKodeRootInit(uVar8,1,rootfn);
    }
    uVar3 = SPRKStepSetMethodName(uVar8,pcVar11);
    if ((int)uVar3 < 0) {
      pcVar11 = "SPRKStepSetMethodName";
      goto LAB_00103fd9;
    }
    uVar3 = SPRKStepSetUseCompensatedSums(uVar8,iVar1);
    if ((int)uVar3 < 0) {
      pcVar11 = "SPRKStepSetUseCompensatedSums";
      goto LAB_00103fd9;
    }
    if (local_210._0_4_ != 0) {
      SolveProblem_cold_1();
      return extraout_EAX;
    }
    uVar3 = ARKodeSetFixedStep(dVar16,uVar8);
    if ((int)uVar3 < 0) {
      pcVar11 = "ARKodeSetFixedStep";
      goto LAB_00103fd9;
    }
    dVar15 = ceil(local_1f0 / dVar16);
    uVar3 = ARKodeSetMaxNumSteps(uVar8,(long)dVar15 + 1);
    if ((int)uVar3 < 0) goto LAB_00103f32;
    uVar3 = ARKodeSetUserData(uVar8,local_1e0);
    if ((int)uVar3 < 0) goto LAB_00103f4f;
    sprintf((char *)local_138,"ark_kepler_conserved_%s-dt-%.2e.txt",dVar16,pcVar11);
    __stream = fopen((char *)local_138,"w+");
    sprintf((char *)local_138,"ark_kepler_solution_%s-dt-%.2e.txt",dVar16,pcVar11);
    local_1e8 = fopen((char *)local_138,"w+");
  }
  else {
    if (iVar4 == 1) {
      uVar8 = ARKStepCreate(0,dydt,0,uVar6,sunctx);
      local_208 = uVar8;
      uVar3 = ARKStepSetTableName(uVar8,"ARKODE_DIRK_NONE",pcVar11);
      if ((int)uVar3 < 0) {
        pcVar11 = "ARKStepSetTableName";
        goto LAB_00103fd9;
      }
      if (iVar5 != 0) {
        ARKodeRootInit(uVar8,1,rootfn);
      }
      uVar3 = ARKodeSetUserData(uVar8,local_1e0);
      if ((int)uVar3 < 0) {
LAB_00103f4f:
        pcVar11 = "ARKodeSetUserData";
        goto LAB_00103fd9;
      }
      dVar15 = ceil(local_1f0 / dVar16);
      uVar3 = ARKodeSetMaxNumSteps(uVar8,(long)dVar15 + 1);
      if ((int)uVar3 < 0) {
LAB_00103f32:
        pcVar11 = "ARKodeSetMaxNumSteps";
LAB_00103fd9:
        iVar5 = fprintf(_stderr,"\nERROR: %s() failed with retval = %d\n\n",pcVar11,(ulong)uVar3);
        return iVar5;
      }
      if (local_210._0_4_ == 0) {
        ARKodeSetFixedStep(dVar16,uVar8);
      }
      else {
        uVar3 = ARKodeSStolerances(dVar16,dVar16,uVar8);
        if ((int)uVar3 < 0) {
          pcVar11 = "ARKodeSStolerances";
          goto LAB_00103fd9;
        }
      }
    }
    else {
      uVar8 = 0;
    }
    sprintf((char *)local_138,"ark_kepler_conserved_%s-dt-%.2e.txt",pcVar11);
    __stream = fopen((char *)local_138,"w+");
    sprintf((char *)local_138,"ark_kepler_solution_%s-dt-%.2e.txt",dVar16,pcVar11);
    local_1e8 = fopen((char *)local_138,"w+");
  }
  sprintf((char *)local_138,"ark_kepler_times_%s-dt-%.2e.txt",dVar16,pcVar11);
  pFVar9 = fopen((char *)local_138,"w+");
  iVar5 = local_200;
  local_1d8 = local_1f0 / (double)local_200;
  local_138[0] = 0.0;
  pdVar10 = (double *)N_VGetArrayPointer(uVar6);
  dVar16 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
  uVar14 = -(ulong)(0.0 < dVar16);
  dVar15 = (pdVar10[2] * pdVar10[2] + pdVar10[3] * pdVar10[3]) * 0.5 +
           (double)(~uVar14 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar16)) & uVar14);
  pdVar10 = (double *)N_VGetArrayPointer(uVar6);
  local_210 = *pdVar10 * pdVar10[3] - pdVar10[2] * pdVar10[1];
  lVar12 = (longdouble)dVar15;
  lVar13 = (longdouble)local_210;
  local_148 = local_210;
  local_140 = dVar15;
  fprintf(_stdout,"t = %.4Lf, H(p,q) = %.16Lf, L(p,q) = %.16Lf\n");
  local_1d0 = pFVar9;
  fprintf(pFVar9,"%.16Lf\n");
  fprintf(__stream,"%.16Lf, %.16Lf\n");
  N_VPrintFile(uVar6,local_1e8);
  dVar16 = local_1d8 + 0.0;
  if (iVar4 == 0) {
    if (0 < iVar5) {
      local_220 = 0.0;
      iVar5 = 0;
      do {
        if (args->use_tstop != 0) {
          ARKodeSetStopTime(dVar16,uVar8);
          uVar8 = local_208;
        }
        iVar4 = ARKodeEvolve(uVar8,uVar6,local_138,1,in_R8,in_R9,lVar12,lVar13);
        pFVar9 = _stdout;
        if (iVar4 == 2) {
          local_220 = local_220 + 0.5;
          fwrite("ROOT RETURN:\t",0xd,1,_stdout);
          uVar8 = local_208;
          ARKodeGetRootInfo(local_208,&local_214);
          local_1a8 = local_220;
          fprintf(_stdout,"  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                  (ulong)local_214);
          pFVar9 = _stdout;
          lVar12 = (longdouble)local_138[0];
          pdVar10 = (double *)N_VGetArrayPointer(uVar6);
          dVar17 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
          uVar14 = -(ulong)(0.0 < dVar17);
          local_1b0 = ((pdVar10[2] * pdVar10[2] + pdVar10[3] * pdVar10[3]) * 0.5 +
                      (double)(~uVar14 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar17)) & uVar14)
                      ) - dVar15;
          local_1fc = (longdouble)local_1b0;
          pdVar10 = (double *)N_VGetArrayPointer(uVar6);
          local_1b8 = (*pdVar10 * pdVar10[3] - pdVar10[2] * pdVar10[1]) - local_210;
          lVar13 = local_1fc;
          fprintf(pFVar9,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
        }
        else {
          if (iVar4 < 0) goto LAB_00103ff3;
          pdVar10 = (double *)N_VGetArrayPointer(uVar6);
          dVar17 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
          uVar14 = -(ulong)(0.0 < dVar17);
          local_188 = ((pdVar10[2] * pdVar10[2] + pdVar10[3] * pdVar10[3]) * 0.5 +
                      (double)(~uVar14 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar17)) & uVar14)
                      ) - dVar15;
          local_1fc = (longdouble)local_188;
          pdVar10 = (double *)N_VGetArrayPointer(uVar6);
          local_190 = (*pdVar10 * pdVar10[3] - pdVar10[2] * pdVar10[1]) - local_210;
          fprintf(pFVar9,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
          fprintf(local_1d0,"%.16Lf\n");
          pdVar10 = (double *)N_VGetArrayPointer(uVar6);
          dVar17 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
          uVar14 = -(ulong)(0.0 < dVar17);
          local_198 = (pdVar10[2] * pdVar10[2] + pdVar10[3] * pdVar10[3]) * 0.5 +
                      (double)(~uVar14 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar17)) & uVar14)
          ;
          lVar12 = (longdouble)local_198;
          pdVar10 = (double *)N_VGetArrayPointer(uVar6);
          local_1a0 = *pdVar10 * pdVar10[3] - pdVar10[2] * pdVar10[1];
          lVar13 = (longdouble)local_1a0;
          fprintf(__stream,"%.16Lf, %.16Lf\n");
          N_VPrintFile(uVar6,local_1e8);
          dVar17 = dVar16 + local_1d8;
          dVar16 = local_1f0;
          if (dVar17 <= local_1f0) {
            dVar16 = dVar17;
          }
          iVar5 = iVar5 + 1;
        }
      } while (iVar5 < local_200);
    }
  }
  else if (0 < iVar5) {
    local_220 = 0.0;
    iVar5 = 0;
    do {
      if (args->use_tstop != 0) {
        ARKodeSetStopTime(dVar16,uVar8);
        uVar8 = local_208;
      }
      iVar4 = ARKodeEvolve(uVar8,uVar6,local_138,1,in_R8,in_R9,lVar12,lVar13);
      pFVar9 = _stdout;
      if (iVar4 == 2) {
        local_220 = local_220 + 0.5;
        fwrite("ROOT RETURN:\t",0xd,1,_stdout);
        uVar8 = local_208;
        ARKodeGetRootInfo(local_208,&local_214);
        local_170 = local_220;
        fprintf(_stdout,"  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                (ulong)local_214);
        pFVar9 = _stdout;
        lVar12 = (longdouble)local_138[0];
        pdVar10 = (double *)N_VGetArrayPointer(uVar6);
        dVar17 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
        uVar14 = -(ulong)(0.0 < dVar17);
        local_178 = ((pdVar10[2] * pdVar10[2] + pdVar10[3] * pdVar10[3]) * 0.5 +
                    (double)(~uVar14 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar17)) & uVar14))
                    - dVar15;
        local_1fc = (longdouble)local_178;
        pdVar10 = (double *)N_VGetArrayPointer(uVar6);
        local_180 = (*pdVar10 * pdVar10[3] - pdVar10[2] * pdVar10[1]) - local_210;
        lVar13 = local_1fc;
        fprintf(pFVar9,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
      }
      else {
        if (iVar4 < 0) goto LAB_00103ff3;
        pdVar10 = (double *)N_VGetArrayPointer(uVar6);
        dVar17 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
        uVar14 = -(ulong)(0.0 < dVar17);
        local_150 = ((pdVar10[2] * pdVar10[2] + pdVar10[3] * pdVar10[3]) * 0.5 +
                    (double)(~uVar14 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar17)) & uVar14))
                    - dVar15;
        local_1fc = (longdouble)local_150;
        pdVar10 = (double *)N_VGetArrayPointer(uVar6);
        local_158 = (*pdVar10 * pdVar10[3] - pdVar10[2] * pdVar10[1]) - local_210;
        fprintf(pFVar9,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
        fprintf(local_1d0,"%.16Lf\n");
        pdVar10 = (double *)N_VGetArrayPointer(uVar6);
        dVar17 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
        uVar14 = -(ulong)(0.0 < dVar17);
        local_160 = (pdVar10[2] * pdVar10[2] + pdVar10[3] * pdVar10[3]) * 0.5 +
                    (double)(~uVar14 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar17)) & uVar14);
        lVar12 = (longdouble)local_160;
        pdVar10 = (double *)N_VGetArrayPointer(uVar6);
        local_168 = *pdVar10 * pdVar10[3] - pdVar10[2] * pdVar10[1];
        lVar13 = (longdouble)local_168;
        fprintf(__stream,"%.16Lf, %.16Lf\n");
        N_VPrintFile(uVar6,local_1e8);
        dVar17 = dVar16 + local_1d8;
        dVar16 = local_1f0;
        if (dVar17 <= local_1f0) {
          dVar16 = dVar17;
        }
        iVar5 = iVar5 + 1;
      }
    } while (iVar5 < local_200);
  }
LAB_00103e33:
  pPVar2 = local_1c0;
  N_VScale(0x3ff0000000000000,uVar6,local_1c0->sol);
  pdVar10 = (double *)N_VGetArrayPointer(uVar6);
  dVar16 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
  uVar14 = -(ulong)(0.0 < dVar16);
  pPVar2->energy_error =
       ((pdVar10[2] * pdVar10[2] + pdVar10[3] * pdVar10[3]) * 0.5 +
       (double)(~uVar14 & 0xfff0000000000000 | (ulong)(-1.0 / SQRT(dVar16)) & uVar14)) - dVar15;
  free(local_1e0);
  fclose(local_1d0);
  fclose(__stream);
  fclose(local_1e8);
  N_VDestroy(uVar6);
  ARKodePrintAllStats(local_208,_stdout,0);
  iVar5 = ARKodeFree(&local_208);
  return iVar5;
LAB_00103ff3:
  SolveProblem_cold_2();
  goto LAB_00103e33;
}

Assistant:

int SolveProblem(ProgramArgs* args, ProblemResult* result, SUNContext sunctx)
{
  void* arkode_mem       = NULL;
  N_Vector y             = NULL;
  SUNNonlinearSolver NLS = NULL;
  UserData udata         = NULL;
  sunrealtype* ydata     = NULL;
  sunrealtype num_orbits = 0;
  FILE* conserved_fp     = NULL;
  FILE* solution_fp      = NULL;
  FILE* times_fp         = NULL;
  int rootsfound         = 0;
  int iout               = 0;
  int retval             = 0;

  const int count_orbits     = args->count_orbits;
  const int step_mode        = args->step_mode;
  const int stepper          = args->stepper;
  const int use_compsums     = args->use_compsums;
  const int num_output_times = args->num_output_times;
  const char* method_name    = args->method_name;
  const sunrealtype dt       = args->dt;
  sunrealtype Tf             = args->tf;

  /* Default problem parameters */
  const sunrealtype T0    = SUN_RCONST(0.0);
  const sunrealtype dTout = (Tf - T0) / ((sunrealtype)num_output_times);
  const sunrealtype ecc   = SUN_RCONST(0.6);

  printf("\n   Begin Kepler Problem\n\n");
  PrintArgs(args);

  /* Allocate and fill udata structure */
  udata      = (UserData)malloc(sizeof(*udata));
  udata->ecc = ecc;

  /* Allocate our state vector */
  y     = N_VNew_Serial(4, sunctx);
  ydata = N_VGetArrayPointer(y);

  /* Fill the initial conditions */
  InitialConditions(y, ecc);

  /* Create SPRKStep integrator */
  if (stepper == 0)
  {
    arkode_mem = SPRKStepCreate(force, velocity, T0, y, sunctx);

    /* Optional: enable temporal root-finding */
    if (count_orbits)
    {
      ARKodeRootInit(arkode_mem, 1, rootfn);
      if (check_retval(&retval, "ARKodeRootInit", 1)) { return 1; }
    }

    retval = SPRKStepSetMethodName(arkode_mem, method_name);
    if (check_retval(&retval, "SPRKStepSetMethodName", 1)) { return 1; }

    retval = SPRKStepSetUseCompensatedSums(arkode_mem, use_compsums);
    if (check_retval(&retval, "SPRKStepSetUseCompensatedSums", 1)) { return 1; }

    if (step_mode == 0)
    {
      retval = ARKodeSetFixedStep(arkode_mem, dt);
      if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

      retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 1);
      if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }
    }
    else
    {
      fprintf(stderr,
              "ERROR: adaptive time-steps are not supported with SPRKStep\n");
      return 1;
    }

    retval = ARKodeSetUserData(arkode_mem, (void*)udata);
    if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }
  }
  else if (stepper == 1)
  {
    arkode_mem = ARKStepCreate(dydt, NULL, T0, y, sunctx);

    retval = ARKStepSetTableName(arkode_mem, "ARKODE_DIRK_NONE", method_name);
    if (check_retval(&retval, "ARKStepSetTableName", 1)) { return 1; }

    if (count_orbits)
    {
      ARKodeRootInit(arkode_mem, 1, rootfn);
      if (check_retval(&retval, "ARKodeRootInit", 1)) { return 1; }
    }

    retval = ARKodeSetUserData(arkode_mem, (void*)udata);
    if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

    retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 1);
    if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

    if (step_mode == 0) { retval = ARKodeSetFixedStep(arkode_mem, dt); }
    else
    {
      retval = ARKodeSStolerances(arkode_mem, dt, dt);
      if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }
    }
  }

  /* Open output files */
  if (stepper == 0)
  {
    const char* fmt1 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    const char* fmt2 = "ark_kepler_solution_%s-dt-%.2e.txt";
    const char* fmt3 = "ark_kepler_times_%s-dt-%.2e.txt";
    char fname[256];
    sprintf(fname, fmt1, method_name, dt);
    conserved_fp = fopen(fname, "w+");
    sprintf(fname, fmt2, method_name, dt);
    solution_fp = fopen(fname, "w+");
    sprintf(fname, fmt3, method_name, dt);
    times_fp = fopen(fname, "w+");
  }
  else
  {
    const char* fmt1 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    const char* fmt2 = "ark_kepler_solution_%s-dt-%.2e.txt";
    const char* fmt3 = "ark_kepler_times_%s-dt-%.2e.txt";
    char fname[256];
    sprintf(fname, fmt1, method_name, dt);
    conserved_fp = fopen(fname, "w+");
    sprintf(fname, fmt2, method_name, dt);
    solution_fp = fopen(fname, "w+");
    sprintf(fname, fmt3, method_name, dt);
    times_fp = fopen(fname, "w+");
  }

  /* Print out starting energy, momentum before integrating */
  sunrealtype tret = T0;
  sunrealtype tout = T0 + dTout;
  sunrealtype H0   = Hamiltonian(y);
  sunrealtype L0   = AngularMomentum(y);
  fprintf(stdout, "t = %.4Lf, H(p,q) = %.16Lf, L(p,q) = %.16Lf\n",
          (long double)tret, (long double)H0, (long double)L0);
  fprintf(times_fp, "%.16Lf\n", (long double)tret);
  fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)H0, (long double)L0);
  N_VPrintFile(y, solution_fp);

  /* Do integration */
  if (stepper == 0)
  {
    while (iout < num_output_times)
    {
      /* Optional: if the stop time is not set, then its possible that the
         exact requested output time will not be hit (even with a fixed
         time-step due to roundoff error accumulation) and interpolation will be
         used to get the solution at the output time. */
      if (args->use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
      retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

      if (retval == ARK_ROOT_RETURN)
      {
        num_orbits += SUN_RCONST(0.5);

        fprintf(stdout, "ROOT RETURN:\t");
        ARKodeGetRootInfo(arkode_mem, &rootsfound);
        fprintf(stdout, "  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                rootsfound, (long double)ydata[0], (long double)ydata[1],
                (long double)num_orbits);
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
      }
      else if (retval >= 0)
      {
        /* Output current integration status */
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
        fprintf(times_fp, "%.16Lf\n", (long double)tret);
        fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)Hamiltonian(y),
                (long double)AngularMomentum(y));

        N_VPrintFile(y, solution_fp);

        tout += dTout;
        tout = (tout > Tf) ? Tf : tout;
        iout++;
      }
      else
      {
        fprintf(stderr, "Solver failure, stopping integration\n");
        break;
      }
    }
  }
  else
  {
    while (iout < num_output_times)
    {
      /* Optional: if the stop time is not set, then its possible that the the
         exact requested output time will not be hit (even with a fixed
         time-step due to roundoff error accumulation) and interpolation will be
         used to get the solution at the output time. */
      if (args->use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
      retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

      if (retval == ARK_ROOT_RETURN)
      {
        num_orbits += SUN_RCONST(0.5);

        fprintf(stdout, "ROOT RETURN:\t");
        ARKodeGetRootInfo(arkode_mem, &rootsfound);
        fprintf(stdout, "  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                rootsfound, (long double)ydata[0], (long double)ydata[1],
                (long double)num_orbits);
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
      }
      else if (retval >= 0)
      {
        /* Output current integration status */
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
        fprintf(times_fp, "%.16Lf\n", (long double)tret);
        fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)Hamiltonian(y),
                (long double)AngularMomentum(y));

        N_VPrintFile(y, solution_fp);

        tout += dTout;
        tout = (tout > Tf) ? Tf : tout;
        iout++;
      }
      else
      {
        fprintf(stderr, "Solver failure, stopping integration\n");
        break;
      }
    }
  }

  /* Copy results */
  N_VScale(SUN_RCONST(1.0), y, result->sol);
  result->energy_error = Hamiltonian(y) - H0;

  free(udata);
  fclose(times_fp);
  fclose(conserved_fp);
  fclose(solution_fp);
  if (NLS) { SUNNonlinSolFree(NLS); }
  N_VDestroy(y);
  ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  ARKodeFree(&arkode_mem);
  return 0;
}